

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_encoder_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::HexEncoderTest_test_decode_from_hex_Test::
~HexEncoderTest_test_decode_from_hex_Test(HexEncoderTest_test_decode_from_hex_Test *this)

{
  HexEncoderTest_test_decode_from_hex_Test *this_local;
  
  ~HexEncoderTest_test_decode_from_hex_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HexEncoderTest, test_decode_from_hex)
{
    ASSERT_EQ((unsigned char) 35, HexEncoder::DecodeFromHex("23").at(0));
    ASSERT_EQ((unsigned char) 0, HexEncoder::DecodeFromHex("00").at(0));
    ASSERT_EQ((unsigned char) 86, HexEncoder::DecodeFromHex("56").at(0));
    ASSERT_EQ((unsigned char) 105, HexEncoder::DecodeFromHex("69").at(0));
    ASSERT_EQ((unsigned char) 91, HexEncoder::DecodeFromHex("5B").at(0));
    ASSERT_EQ((unsigned char) 121, HexEncoder::DecodeFromHex("79").at(0));
}